

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::printOriginalList(Graph *this)

{
  bool bVar1;
  ostream *poVar2;
  reference piVar3;
  int *j;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *i;
  vector<int,_std::allocator<int>_> *__end1;
  vector<int,_std::allocator<int>_> *__begin1;
  vector<int,_std::allocator<int>_> (*__range1) [50];
  Graph *this_local;
  
  if ((this->adjoint_status & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Original Graph: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (__end1 = this->original_list; __end1 != this->pred_list; __end1 = __end1 + 1) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(__end1);
      if (!bVar1) {
        __end2 = std::vector<int,_std::allocator<int>_>::begin(__end1);
        j = (int *)std::vector<int,_std::allocator<int>_>::end(__end1);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&j), bVar1) {
          piVar3 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end2);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
          std::operator<<(poVar2,' ');
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&__end2);
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void Graph::printOriginalList(){
   if(not(this->adjoint_status)) return void();
   cout << "Original Graph: "<<endl;
   for(const auto &i : this->original_list){
      if(i.empty()) continue;
      for(const int &j: i)
         cout<< j << ' ';
      cout << endl;
   }
}